

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Federate.cpp
# Opt level: O0

string * __thiscall helics::Federate::queryComplete_abi_cxx11_(Federate *this,QueryId *queryIndex)

{
  bool bVar1;
  IdentifierId<unsigned_int,_(helics::Identifiers)113,_4294967295U> *in_RDX;
  char *in_RSI;
  string *in_RDI;
  iterator fnd;
  handle asyncInfo;
  shared_guarded<helics::AsyncFedCallInfo,_std::mutex> *in_stack_ffffffffffffff08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  string *__a;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff50;
  string *in_stack_ffffffffffffff68;
  JsonErrorCodes in_stack_ffffffffffffff74;
  _Self local_80;
  uint local_74;
  _Self local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  allocator<char> local_39 [57];
  
  if ((in_RSI[0xe] & 1U) == 0) {
    __a = in_RDI;
    std::
    unique_ptr<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>,_std::default_delete<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>_>_>
    ::operator->((unique_ptr<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>,_std::default_delete<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>_>_>
                  *)0x22f054);
    this_00 = &local_68;
    gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>::lock
              (in_stack_ffffffffffffff08);
    gmlc::libguarded::lock_handle<helics::AsyncFedCallInfo,_std::mutex>::operator->
              ((lock_handle<helics::AsyncFedCallInfo,_std::mutex> *)this_00);
    local_74 = IdentifierId<unsigned_int,_(helics::Identifiers)113,_4294967295U>::value(in_RDX);
    local_70._M_node =
         (_Base_ptr)
         std::
         map<int,_std::future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
         ::find((map<int,_std::future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 *)in_stack_ffffffffffffff08,(key_type *)0x22f09f);
    gmlc::libguarded::lock_handle<helics::AsyncFedCallInfo,_std::mutex>::operator->
              ((lock_handle<helics::AsyncFedCallInfo,_std::mutex> *)&local_68);
    local_80._M_node =
         (_Base_ptr)
         std::
         map<int,_std::future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
         ::end((map<int,_std::future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                *)in_stack_ffffffffffffff08);
    bVar1 = std::operator==(&local_70,&local_80);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffff50,in_RSI,(allocator<char> *)__a);
      generateJsonErrorResponse(in_stack_ffffffffffffff74,in_stack_ffffffffffffff68);
      std::__cxx11::string::~string(this_00);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff57);
      in_RDI = __a;
    }
    else {
      std::
      _Rb_tree_iterator<std::pair<const_int,_std::future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator->((_Rb_tree_iterator<std::pair<const_int,_std::future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)0x22f0f8);
      std::future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::get((future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)in_RDI);
      in_RDI = __a;
    }
    gmlc::libguarded::lock_handle<helics::AsyncFedCallInfo,_std::mutex>::~lock_handle
              ((lock_handle<helics::AsyncFedCallInfo,_std::mutex> *)0x22f1d7);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffff50,in_RSI,(allocator<char> *)in_RDI);
    generateJsonErrorResponse(in_stack_ffffffffffffff74,in_stack_ffffffffffffff68);
    std::__cxx11::string::~string(in_stack_ffffffffffffff10);
    std::allocator<char>::~allocator(local_39);
  }
  return in_RDI;
}

Assistant:

std::string Federate::queryComplete(QueryId queryIndex)  // NOLINT
{
    if (singleThreadFederate) {
        return generateJsonErrorResponse(
            JsonErrorCodes::METHOD_NOT_ALLOWED,
            "Async queries are not allowed when using single thread federates");
    }
    auto asyncInfo = asyncCallInfo->lock();
    auto fnd = asyncInfo->inFlightQueries.find(queryIndex.value());
    if (fnd != asyncInfo->inFlightQueries.end()) {
        return fnd->second.get();
    }
    return generateJsonErrorResponse(JsonErrorCodes::METHOD_NOT_ALLOWED,
                                     "No Async queries are available");
}